

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O3

void merge_3way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **result)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  uchar *__s1;
  long lVar8;
  uchar *__s2;
  uchar *__s2_00;
  uchar **local_60;
  uchar **local_58;
  uchar **local_50;
  uchar **local_48;
  size_t local_40;
  size_t local_38;
  
  local_60 = result;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_3way",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(), n0=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n2=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  __s1 = *from0;
  if (__s1 == (uchar *)0x0) {
LAB_00229194:
    __assert_fail("a != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x32,"int cmp(const unsigned char *, const unsigned char *)");
  }
  __s2_00 = *from1;
  if (__s2_00 != (uchar *)0x0) {
    __s2 = *from2;
    iVar2 = strcmp((char *)__s1,(char *)__s2_00);
    if (__s2 != (uchar *)0x0) {
      iVar3 = strcmp((char *)__s2_00,(char *)__s2);
      local_40 = n2;
      local_50 = from2;
      local_38 = n1;
      local_58 = from1;
      local_48 = from0;
      if (-1 < iVar2) {
        if (iVar2 != 0) {
          if (0 < iVar3) goto LAB_00228ac9;
          if (iVar3 == 0) goto LAB_00228cd1;
          iVar2 = strcmp((char *)__s1,(char *)__s2);
          if (iVar2 < 0) goto LAB_00228bd3;
          if (iVar2 != 0) goto LAB_00228cd1;
          goto LAB_00229024;
        }
        if (iVar3 < 0) goto LAB_00228f8d;
        if (iVar3 != 0) goto LAB_00228eb6;
        goto LAB_002290a6;
      }
      if (iVar3 < 0) goto LAB_00228f8d;
      if (iVar3 == 0) goto LAB_002290a6;
      iVar2 = strcmp((char *)__s1,(char *)__s2);
      if (0 < iVar2) goto LAB_00228dc1;
LAB_002289de:
      lVar8 = 0;
      while( true ) {
        n0 = n0 - 1;
        *(uchar **)((long)local_60 + lVar8) = __s1;
        if (n0 == 0) break;
        __s1 = *(uchar **)((long)local_48 + lVar8 + 8);
        if (__s1 == (uchar *)0x0) goto LAB_00229194;
        if (__s2 == (uchar *)0x0) goto LAB_00229175;
        iVar2 = strcmp((char *)__s1,(char *)__s2);
        bVar5 = 4;
        if (0 < iVar2) {
          iVar2 = strcmp((char *)__s1,(char *)__s2_00);
          if (iVar2 < 0) {
            local_60 = (uchar **)((long)local_60 + lVar8 + 8);
            local_48 = (uchar **)((long)local_48 + lVar8 + 8);
            goto LAB_00228dc1;
          }
          bVar5 = iVar2 == 0 ^ 7;
        }
        lVar8 = lVar8 + 8;
        if (bVar5 != 4) {
          if (bVar5 != 6) {
            local_60 = (uchar **)((long)local_60 + lVar8);
            local_48 = (uchar **)((long)local_48 + lVar8);
            goto LAB_00228ac9;
          }
          local_60 = (uchar **)((long)local_60 + lVar8);
          local_48 = (uchar **)((long)local_48 + lVar8);
LAB_00228eb6:
          lVar8 = 0;
          do {
            *(uchar **)((long)local_60 + lVar8) = __s2;
            if (local_40 == 1) goto LAB_00228f2f;
            __s2 = *(uchar **)((long)local_50 + lVar8 + 8);
            if (__s2 == (uchar *)0x0) goto LAB_00229194;
            if (__s1 == (uchar *)0x0) goto LAB_00229175;
            iVar2 = strcmp((char *)__s2,(char *)__s1);
            bVar5 = iVar2 == 0 | 2;
            if (iVar2 < 0) {
              bVar5 = 6;
            }
            lVar8 = lVar8 + 8;
            local_40 = local_40 - 1;
          } while (bVar5 == 6);
          if (bVar5 != 2) {
            local_60 = (uchar **)((long)local_60 + lVar8);
            local_50 = (uchar **)((long)local_50 + lVar8);
            goto LAB_002290a6;
          }
          local_60 = (uchar **)((long)local_60 + lVar8);
          local_50 = (uchar **)((long)local_50 + lVar8);
          from1 = local_58;
LAB_00228f8d:
          lVar8 = 0;
          do {
            n0 = n0 - 1;
            *(uchar **)((long)local_60 + lVar8) = __s1;
            local_58 = from1;
            if (n0 == 0) goto LAB_00229109;
            __s1 = *(uchar **)((long)local_48 + lVar8 + 8);
            if (__s1 == (uchar *)0x0) goto LAB_00229194;
            iVar2 = strcmp((char *)__s1,(char *)__s2_00);
            bVar5 = 1;
            if (0 < iVar2) {
              iVar2 = strcmp((char *)__s1,(char *)__s2);
              if (iVar2 < 0) {
                local_60 = (uchar **)((long)local_60 + lVar8 + 8);
                local_48 = (uchar **)((long)local_48 + lVar8 + 8);
                goto LAB_00228bd3;
              }
              bVar5 = iVar2 == 0 | 4;
            }
            lVar8 = lVar8 + 8;
          } while (bVar5 == 1);
          if (bVar5 == 0) {
switchD_00228d79_caseD_6:
            return;
          }
          if (bVar5 == 4) {
            local_60 = (uchar **)((long)local_60 + lVar8);
            local_48 = (uchar **)((long)local_48 + lVar8);
            goto LAB_00228cd1;
          }
          local_60 = (uchar **)((long)local_60 + lVar8);
          local_48 = (uchar **)((long)local_48 + lVar8);
LAB_00229024:
          lVar8 = 0;
          do {
            *(uchar **)((long)local_60 + lVar8) = __s2_00;
            if (local_38 == 1) {
              lVar8 = (long)local_60 + lVar8;
              local_38 = n0;
              local_58 = local_48;
              goto LAB_00229153;
            }
            __s2_00 = *(uchar **)((long)from1 + lVar8 + 8);
            if (__s2_00 == (uchar *)0x0) goto LAB_00229194;
            if (__s1 == (uchar *)0x0) goto LAB_00229175;
            iVar2 = strcmp((char *)__s2_00,(char *)__s1);
            cVar6 = (iVar2 != 0) + '\x03';
            if (iVar2 < 0) {
              cVar6 = '\n';
            }
            lVar8 = lVar8 + 8;
            local_38 = local_38 - 1;
          } while (cVar6 == '\n');
          if (cVar6 == '\x03') {
            local_60 = (uchar **)((long)local_60 + lVar8);
            local_58 = (uchar **)((long)from1 + lVar8);
LAB_002290a6:
            do {
              lVar8 = 0;
              do {
                *(uchar **)((long)local_60 + lVar8) = __s1;
                if (n0 == 1) {
                  lVar8 = (long)local_60 + lVar8;
                  goto LAB_00229153;
                }
                __s1 = *(uchar **)((long)local_48 + lVar8 + 8);
                if (__s1 == (uchar *)0x0) goto LAB_00229194;
                if (*local_58 == (uchar *)0x0) goto LAB_00229175;
                iVar2 = strcmp((char *)__s1,(char *)*local_58);
                lVar8 = lVar8 + 8;
                n0 = n0 - 1;
              } while (iVar2 < 1);
              local_60 = (uchar **)((long)local_60 + lVar8);
              local_48 = (uchar **)((long)local_48 + lVar8);
LAB_00228cd1:
              lVar1 = 0;
              do {
                lVar8 = lVar1;
                local_38 = local_38 - 1;
                *(uchar **)((long)local_60 + lVar8) = __s2_00;
                if (local_38 == 0) goto LAB_00228d9d;
                __s2_00 = *(uchar **)((long)local_58 + lVar8 + 8);
                if (__s2_00 == (uchar *)0x0) goto LAB_00229194;
                if (__s2 == (uchar *)0x0) goto LAB_00229175;
                iVar2 = strcmp((char *)__s2_00,(char *)__s2);
                cVar6 = '\b';
                if (-1 < iVar2) {
                  if (iVar2 == 0) goto switchD_00228d79_caseD_d;
                  if (__s1 == (uchar *)0x0) goto LAB_00229175;
                  iVar2 = strcmp((char *)__s2_00,(char *)__s1);
                  if (iVar2 < 0) goto switchD_00228d79_caseD_7;
                  cVar6 = (iVar2 == 0) * '\t' + '\x05';
                }
                lVar1 = lVar8 + 8;
              } while (cVar6 == '\b');
              switch(cVar6) {
              case '\x05':
                goto switchD_00228d79_caseD_5;
              default:
                goto switchD_00228d79_caseD_6;
              case '\a':
switchD_00228d79_caseD_7:
                local_60 = (uchar **)((long)local_60 + lVar8 + 8);
                local_58 = (uchar **)((long)local_58 + lVar8 + 8);
LAB_00228ac9:
                lVar8 = 0;
                do {
                  local_40 = local_40 - 1;
                  *(uchar **)((long)local_60 + lVar8) = __s2;
                  if (local_40 == 0) goto LAB_00228f2f;
                  __s2 = *(uchar **)((long)local_50 + lVar8 + 8);
                  if (__s2 == (uchar *)0x0) goto LAB_00229194;
                  if (__s2_00 == (uchar *)0x0) goto LAB_00229175;
                  iVar2 = strcmp((char *)__s2,(char *)__s2_00);
                  iVar3 = 7;
                  if (-1 < iVar2) {
                    if (iVar2 == 0) goto LAB_00228b76;
                    if (__s1 == (uchar *)0x0) goto LAB_00229175;
                    iVar2 = strcmp((char *)__s2,(char *)__s1);
                    iVar3 = 9;
                    if (iVar2 == 0) {
                      iVar3 = 0x13;
                    }
                    if (iVar2 < 0) goto LAB_00228b76;
                  }
                  lVar8 = lVar8 + 8;
                } while (iVar3 == 7);
                if (iVar3 != 9) {
                  if (iVar3 != 0x13) {
                    return;
                  }
                  local_60 = (uchar **)((long)local_60 + lVar8);
                  local_50 = (uchar **)((long)local_50 + lVar8);
                  from1 = local_58;
                  goto LAB_00229024;
                }
                local_60 = (uchar **)((long)local_60 + lVar8);
                local_50 = (uchar **)((long)local_50 + lVar8);
LAB_00228bd3:
                lVar8 = 0;
                break;
              case '\r':
switchD_00228d79_caseD_d:
                local_60 = (uchar **)((long)local_60 + lVar8 + 8);
                local_58 = (uchar **)((long)local_58 + lVar8 + 8);
                goto LAB_00228cd1;
              case '\x0e':
                local_60 = (uchar **)((long)local_60 + lVar1);
                local_58 = (uchar **)((long)local_58 + lVar1);
                goto LAB_00228eb6;
              }
              do {
                local_38 = local_38 - 1;
                *(uchar **)((long)local_60 + lVar8) = __s2_00;
                if (local_38 == 0) {
LAB_00228d9d:
                  lVar8 = (long)local_60 + lVar8;
                  local_38 = n0;
                  local_58 = local_48;
                  goto LAB_00229153;
                }
                __s2_00 = *(uchar **)((long)local_58 + lVar8 + 8);
                if (__s2_00 == (uchar *)0x0) goto LAB_00229194;
                if (__s1 == (uchar *)0x0) goto LAB_00229175;
                iVar2 = strcmp((char *)__s2_00,(char *)__s1);
                cVar6 = '\t';
                if (-1 < iVar2) {
                  if (iVar2 != 0) {
                    if (__s2 == (uchar *)0x0) goto LAB_00229175;
                    iVar2 = strcmp((char *)__s2_00,(char *)__s2);
                    if (-1 < iVar2) {
                      cVar6 = (iVar2 != 0) + '\x03';
                      goto LAB_00228c4a;
                    }
                  }
                  local_60 = (uchar **)((long)local_60 + lVar8 + 8);
                  from1 = (uchar **)((long)local_58 + lVar8 + 8);
                  goto LAB_00228f8d;
                }
LAB_00228c4a:
                lVar8 = lVar8 + 8;
              } while (cVar6 == '\t');
              if (cVar6 != '\x03') {
                if (cVar6 != '\x04') {
                  return;
                }
                local_60 = (uchar **)((long)local_60 + lVar8);
                local_58 = (uchar **)((long)local_58 + lVar8);
                goto LAB_002289de;
              }
              local_60 = (uchar **)((long)local_60 + lVar8);
              local_58 = (uchar **)((long)local_58 + lVar8);
            } while( true );
          }
          local_60 = (uchar **)((long)local_60 + lVar8);
          local_58 = (uchar **)((long)from1 + lVar8);
          goto LAB_002289de;
        }
      }
LAB_00229109:
      lVar8 = (long)local_60 + lVar8;
      goto LAB_00229153;
    }
  }
LAB_00229175:
  __assert_fail("b != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x33,"int cmp(const unsigned char *, const unsigned char *)");
LAB_00228b76:
  local_60 = (uchar **)((long)local_60 + lVar8 + 8);
  local_50 = (uchar **)((long)local_50 + lVar8 + 8);
  goto LAB_00228cd1;
switchD_00228d79_caseD_5:
  local_60 = (uchar **)((long)local_60 + lVar1);
  local_58 = (uchar **)((long)local_58 + lVar1);
LAB_00228dc1:
  lVar1 = 0;
  do {
    lVar8 = lVar1;
    local_40 = local_40 - 1;
    *(uchar **)((long)local_60 + lVar8) = __s2;
    if (local_40 == 0) {
      lVar8 = (long)local_60 + lVar8;
      local_40 = local_38;
      local_50 = local_58;
      local_38 = n0;
      local_58 = local_48;
      goto LAB_00229153;
    }
    __s2 = *(uchar **)((long)local_50 + lVar8 + 8);
    if (__s2 == (uchar *)0x0) goto LAB_00229194;
    if (__s1 == (uchar *)0x0) goto LAB_00229175;
    iVar2 = strcmp((char *)__s2,(char *)__s1);
    uVar7 = 5;
    if (-1 < iVar2) {
      if (iVar2 == 0) goto LAB_00228e7a;
      iVar2 = strcmp((char *)__s2,(char *)__s2_00);
      uVar7 = 2;
      if (iVar2 == 0) {
        uVar7 = 0x11;
      }
      if (iVar2 < 0) goto LAB_00228e7a;
    }
    lVar1 = lVar8 + 8;
  } while (uVar7 == 5);
  if (uVar7 < 0x10) {
    if (uVar7 == 2) {
      local_60 = (uchar **)((long)local_60 + lVar1);
      local_50 = (uchar **)((long)local_50 + lVar1);
      from1 = local_58;
      goto LAB_00228f8d;
    }
    if (uVar7 != 4) {
      return;
    }
  }
  else if (uVar7 != 0x10) {
    if (uVar7 != 0x11) {
      return;
    }
    local_60 = (uchar **)((long)local_60 + lVar1);
    local_50 = (uchar **)((long)local_50 + lVar1);
    goto LAB_002290a6;
  }
LAB_00228e7a:
  local_60 = (uchar **)((long)local_60 + lVar8 + 8);
  local_50 = (uchar **)((long)local_50 + lVar8 + 8);
  goto LAB_002289de;
LAB_00228f2f:
  lVar8 = (long)local_60 + lVar8;
  local_40 = local_38;
  local_50 = local_58;
  local_38 = n0;
  local_58 = local_48;
LAB_00229153:
  merge_2way(local_58,local_38,local_50,local_40,(uchar **)(lVar8 + 8));
  return;
}

Assistant:

static void
merge_3way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	unsigned char* key2 = *from2;
	const int cmp01 = cmp(key0, key1);
	const int cmp12 = cmp(key1, key2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(key0, key2);
		if (cmp02 <= 0) { goto state0lt2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1lt2lt0; }
	cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;

#define StrictCase(a,b,c)                                                      \
        state##a##lt##b##lt##c:                                                \
        {                                                                      \
                *result++ = key##a;                                            \
                if (--n##a == 0) goto finish##a;                               \
                ++from##a;                                                     \
                key##a = *from##a;                                             \
                const int cmpab = cmp(key##a, key##b);                         \
                if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
                if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
                const int cmpac = cmp(key##a, key##c);                         \
                if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
                if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
                goto state##b##lt##c##lt##a;                                   \
        }
        StrictCase(1, 0, 2)
        StrictCase(1, 2, 0)
        StrictCase(2, 0, 1)
        StrictCase(2, 1, 0)
#undef StrictCase

state0lt1lt2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 <= 0) goto state0lt1lt2;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  goto state1lt0lt2;
	if (cmp02 == 0) goto state1lt0eq2;
	goto state1lt2lt0;
}
state0lt2lt1:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 <= 0) goto state0lt2lt1;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 < 0)  goto state2lt0lt1;
	if (cmp01 == 0) goto state2lt0eq1;
	goto state2lt1lt0;
}

// No advantage from equality of first two strings.
state0eq1lt2: goto state0lt1lt2;
state0eq2lt1: goto state0lt2lt1;
state1eq2lt0: goto state1lt2lt0;

// Fix order.
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;

state0lt1eq2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(*from0, *from1);
	if (cmp01 <= 0) goto state0lt1eq2;
	goto state1lt2lt0;
}
state1lt0eq2:
{
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp10 = cmp(key1, key0);
	if (cmp10 < 0)  goto state1lt0eq2;
	if (cmp10 == 0) goto state0lt1eq2;
	goto state0lt2lt1;
}
state2lt0eq1:
{
	*result++ = key2;
	if (--n2 == 0) goto finish2;
	++from2;
	key2 = *from2;
	const int cmp20 = cmp(key2, key0);
	if (cmp20 < 0)  goto state2lt0eq1;
	if (cmp20 == 0) goto state0lt1eq2;
	goto state0lt1lt2;
}
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;

finish0:
	assert(n0 == 0);
	merge_2way(from1, n1, from2, n2, result);
	return;
finish1:
	assert(n1 == 0);
	merge_2way(from0, n0, from2, n2, result);
	return;
finish2:
	assert(n2 == 0);
	merge_2way(from0, n0, from1, n1, result);
	return;
}